

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandLine
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *fname,cmCustomCommandGenerator *ccg
          )

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  pointer pbVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  pointer pbVar6;
  char local_49;
  cmCustomCommandGenerator *local_48;
  pointer local_40;
  string *local_38;
  
  local_48 = ccg;
  local_38 = fname;
  pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
  pbVar4 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != local_40) {
    bVar5 = true;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
      std::__ostream_insert<char,std::char_traits<char>>(fout,"    :outputName=\"",0x11);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
      if (bVar5) {
        pvVar2 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(local_48);
        pbVar1 = (pvVar2->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (pvVar2->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>(fout,"    :extraOutputFile=\"",0x16);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (fout,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
        }
        pvVar2 = cmCustomCommandGenerator::GetDepends_abi_cxx11_(local_48);
        pbVar1 = (pvVar2->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (pvVar2->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>(fout,"    :depends=\"",0xe);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (fout,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
        }
      }
      pbVar4 = pbVar4 + 1;
      bVar5 = false;
    } while (pbVar4 != local_40);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandLine(
  std::ostream& fout, std::string& fname, cmCustomCommandGenerator const& ccg)
{
  /* NOTE: Customization Files are not well documented.  Testing showed
   * that ":outputName=file" can only be used once per script.  The
   * script will only run if ":outputName=file" is missing or just run
   * once if ":outputName=file" is not specified.  If there are
   * multiple outputs then the script needs to be listed multiple times
   * for each output.  Otherwise it won't rerun the script if one of
   * the outputs is manually deleted.
   */
  bool specifyExtra = true;
  for (const auto& out : ccg.GetOutputs()) {
    fout << fname << '\n';
    fout << "    :outputName=\"" << out << "\"\n";
    if (specifyExtra) {
      for (const auto& byp : ccg.GetByproducts()) {
        fout << "    :extraOutputFile=\"" << byp << "\"\n";
      }
      for (const auto& dep : ccg.GetDepends()) {
        fout << "    :depends=\"" << dep << "\"\n";
      }
      specifyExtra = false;
    }
  }
}